

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,4,4>,tcu::Matrix<float,4,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  ResultCollector *this_00;
  undefined8 *puVar1;
  bool *pbVar2;
  _Rb_tree_node_base *p_Var3;
  FloatFormat *pFVar4;
  ostringstream *this_01;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_4,_4>_> *pVVar7;
  pointer pcVar8;
  double dVar9;
  undefined8 uVar10;
  PrecisionCase *pPVar11;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  *pVVar12;
  bool bVar13;
  bool bVar14;
  ContextType type;
  int iVar15;
  uint uVar16;
  _Base_ptr p_Var17;
  char *__s;
  size_t sVar18;
  long *plVar19;
  ShaderExecutor *pSVar20;
  Interval *pIVar21;
  IVal *pIVar22;
  MessageBuilder *pMVar23;
  TestError *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  undefined1 *puVar25;
  Matrix<float,_4,_4> *val;
  long lVar26;
  long lVar27;
  ulong uVar28;
  IVal in2;
  IVal in3;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  outputs;
  Environment env;
  ostringstream os;
  ShaderSpec spec;
  IVal in1;
  FloatFormat highpFmt;
  FuncSet funcs;
  ostringstream oss;
  PrecisionCase *local_7d8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  *local_7d0;
  string local_7c8;
  Matrix<float,_4,_4> *local_7a8;
  size_t local_7a0;
  Statement *local_798;
  string local_790;
  ulong local_770;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_768;
  FloatFormat *local_760;
  ulong local_758;
  ulong local_750;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  local_748;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_718;
  undefined1 local_6e8 [8];
  pointer pVStack_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  VarType local_6c8 [3];
  ios_base local_678 [8];
  ios_base local_670 [272];
  undefined1 local_560 [56];
  _Alloc_hider local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  _Alloc_hider local_508;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [376];
  double dStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  double local_348;
  undefined1 local_338 [8];
  _Rb_tree_node_base _Stack_330;
  double local_310;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_308;
  undefined4 local_300;
  ios_base local_2c0 [264];
  undefined1 local_1b8 [112];
  ios_base local_148 [280];
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_7a0 = (long)pMVar6 - (long)pMVar5 >> 6;
  local_798 = stmt;
  local_768 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_4,_4>,_tcu::Matrix<float,_4,_4>_>_>
  ::Outputs(&local_748,local_7a0);
  local_528._M_p = (pointer)&local_518;
  local_560._0_4_ = GLSL_VERSION_300_ES;
  local_560._8_8_ = (pointer)0x0;
  local_560._16_8_ = (pointer)0x0;
  local_560._24_8_ = (pointer)0x0;
  local_560._32_8_ = (pointer)0x0;
  local_560._40_8_ = (pointer)0x0;
  local_560._48_8_ = (pointer)0x0;
  local_520 = 0;
  local_518._M_local_buf[0] = '\0';
  local_508._M_p = (pointer)&local_4f8;
  local_500 = 0;
  local_4f8._M_local_buf[0] = '\0';
  local_348 = (this->m_ctx).highpFormat.m_maxValue;
  local_4d8._368_8_ = *(undefined8 *)&(this->m_ctx).highpFormat;
  dStack_360 = *(double *)&(this->m_ctx).highpFormat.m_fractionBits;
  local_358._0_4_ = (this->m_ctx).highpFormat.m_hasInf;
  local_358._4_4_ = (this->m_ctx).highpFormat.m_hasNaN;
  uStack_350 = *(undefined8 *)&(this->m_ctx).highpFormat.m_exactPrecision;
  local_718._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_718._M_impl.super__Rb_tree_header._M_header;
  local_718._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_718._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_718._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6e8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_718._M_impl.super__Rb_tree_header._M_header._M_right =
       local_718._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_6e0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_6e0,"Statement: ",0xb);
  (*local_798->_vptr_Statement[2])(local_798,(ostringstream *)&pVStack_6e0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_7d8 = this;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_6e0);
  std::ios_base::~ios_base(local_670);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
  p_Var3 = (_Rb_tree_node_base *)(local_338 + 8);
  _Stack_330._M_color = _S_red;
  _Stack_330._M_parent = (_Base_ptr)0x0;
  local_310 = 0.0;
  _Stack_330._M_left = p_Var3;
  _Stack_330._M_right = p_Var3;
  (*local_798->_vptr_Statement[4])(local_798,local_338);
  if (_Stack_330._M_left != p_Var3) {
    p_Var17 = _Stack_330._M_left;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1b8);
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var3);
  }
  pPVar11 = local_7d8;
  if (local_310 != 0.0) {
    local_6e8 = (undefined1  [8])((local_7d8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_6e0,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_6e0,(char *)local_4e8._0_8_,local_4e8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_4e8._0_8_ != (IVal *)local_4d8) {
      operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_6e0);
    std::ios_base::~ios_base(local_670);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base(local_148);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e8,"precision ",10);
  __s = glu::getPrecisionName((pPVar11->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_7d8 + *(long *)((long)local_6e8 + -0x18)) + 0xf0);
  }
  else {
    sVar18 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e8,__s,sVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6e8," float;\n",8);
  std::__cxx11::stringbuf::str();
  local_7d0 = variables;
  std::__cxx11::string::operator=((string *)&local_528,(string *)local_1b8);
  pcVar8 = local_1b8 + 0x10;
  if ((pointer)local_1b8._0_8_ != pcVar8) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
  std::ios_base::~ios_base(local_678);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_7d8->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_560._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_7d8->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "#extension ",&local_7d8->m_extension);
    plVar19 = (long *)std::__cxx11::string::append(local_1b8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 == paVar24) {
      local_6d8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_6d8._8_8_ = plVar19[3];
      local_6e8 = (undefined1  [8])&local_6d8;
    }
    else {
      local_6d8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_6e8 = (undefined1  [8])*plVar19;
    }
    pVStack_6e0 = (pointer)plVar19[1];
    *plVar19 = (long)paVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_528,(string *)local_6e8);
    if (local_6e8 != (undefined1  [8])&local_6d8) {
      operator_delete((void *)local_6e8,local_6d8._M_allocated_capacity + 1);
    }
    if ((pointer)local_1b8._0_8_ != pcVar8) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_560 + 8),1);
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_6e8,local_7d8,
             (local_7d0->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar10 = local_560._8_8_;
  std::__cxx11::string::operator=((string *)local_560._8_8_,(string *)local_6e8);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),local_6c8);
  glu::VarType::~VarType(local_6c8);
  if (local_6e8 != (undefined1  [8])&local_6d8) {
    operator_delete((void *)local_6e8,local_6d8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_560 + 0x20),2);
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_6e8,local_7d8,
             (local_7d0->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar10 = local_560._32_8_;
  std::__cxx11::string::operator=((string *)(local_560._32_8_ + 0x38),(string *)local_6e8);
  glu::VarType::operator=(&((pointer)(uVar10 + 0x38))->varType,local_6c8);
  glu::VarType::~VarType(local_6c8);
  if (local_6e8 != (undefined1  [8])&local_6d8) {
    operator_delete((void *)local_6e8,local_6d8._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Matrix<float,4,4>>
            ((Symbol *)local_6e8,local_7d8,
             (local_7d0->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr);
  uVar10 = local_560._32_8_;
  std::__cxx11::string::operator=((string *)local_560._32_8_,(string *)local_6e8);
  glu::VarType::operator=((VarType *)(uVar10 + 0x20),local_6c8);
  glu::VarType::~VarType(local_6c8);
  if (local_6e8 != (undefined1  [8])&local_6d8) {
    operator_delete((void *)local_6e8,local_6d8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6e8);
  pVVar12 = local_7d0;
  (*local_798->_vptr_Statement[2])(local_798,local_6e8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6e8);
  std::ios_base::~ios_base(local_678);
  std::__cxx11::string::operator=((string *)&local_508,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar8) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  pPVar11 = local_7d8;
  pSVar20 = ShaderExecUtil::createExecutor
                      ((local_7d8->m_ctx).renderContext,(local_7d8->m_ctx).shaderType,
                       (ShaderSpec *)local_560);
  local_6e8 = (undefined1  [8])
              (local_768->in0).
              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pVStack_6e0 = (local_768->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_6d8._M_allocated_capacity =
       (size_type)
       (local_768->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_6d8._8_8_ =
       (local_768->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8._0_8_ =
       local_748.out0.
       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1b8._8_8_ =
       local_748.out1.
       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*pSVar20->_vptr_ShaderExecutor[3])
            (pSVar20,((pPVar11->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar15 = (*pSVar20->_vptr_ShaderExecutor[2])(pSVar20);
  if ((char)iVar15 == '\0') {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar20->_vptr_ShaderExecutor[5])(pSVar20);
  (*pSVar20->_vptr_ShaderExecutor[6])(pSVar20,local_7a0,local_6e8,local_1b8);
  (*pSVar20->_vptr_ShaderExecutor[1])(pSVar20);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_6e8);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b8);
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_338);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_718,
             (pVVar12->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_6e8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_718,
             (pVVar12->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_4e8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_718,
             (pVVar12->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_7c8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_718,
             (pVVar12->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_790);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_718,
             (pVVar12->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_1b8);
  Environment::bind<tcu::Matrix<float,4,4>>
            ((Environment *)&local_718,
             (pVVar12->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
             .m_ptr,(IVal *)local_338);
  if (pMVar6 == pMVar5) {
LAB_01774362:
    local_6e8 = (undefined1  [8])((local_7d8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_6e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_6e0,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_6e0," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_760 = &(local_7d8->m_ctx).floatFormat;
    this_00 = &local_7d8->m_status;
    local_750 = local_7a0 + (local_7a0 == 0);
    uVar28 = 0;
    local_770 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_6e8);
      tcu::Matrix<tcu::Interval,_4,_4>::Matrix((Matrix<tcu::Interval,_4,_4> *)local_1b8);
      local_758 = uVar28;
      if ((uVar28 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_7d8->super_TestCase).super_TestNode.m_testCtx);
      }
      pFVar4 = local_760;
      local_7a8 = (Matrix<float,_4,_4> *)(local_758 * 0x40);
      round<tcu::Matrix<float,4,4>>
                ((IVal *)local_4e8,(BuiltinPrecisionTests *)local_760,
                 (FloatFormat *)
                 ((long)(local_7a8->m_data).m_data[0].m_data +
                 (long)(local_768->in0).
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start),local_7a8);
      pVVar12 = local_7d0;
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_338,pFVar4,(IVal *)local_4e8);
      pIVar21 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_718,
                           (pVVar12->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      lVar26 = 0;
      pFVar4 = (FloatFormat *)(local_4d8 + 0x170);
      pMVar23 = (MessageBuilder *)local_338;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)((long)&pIVar21->m_hi + lVar27) =
               *(undefined8 *)
                (&(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar27);
          puVar1 = (undefined8 *)((long)&pMVar23->m_log + lVar27);
          dVar9 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_4> *)&pIVar21->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar27;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar9;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar26 = lVar26 + 1;
        pIVar21 = pIVar21 + 1;
        pMVar23 = (MessageBuilder *)
                  &(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar26 != 4);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_718,
                 (pVVar12->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_718,
                 (pVVar12->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_718,
                 (pVVar12->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      _Stack_330._M_right = (_Base_ptr)local_760->m_maxValue;
      local_338 = *(undefined1 (*) [8])local_760;
      _Stack_330._M_color = local_760->m_fractionBits;
      _Stack_330._4_4_ = local_760->m_hasSubnormal;
      _Stack_330._M_parent = *(_Base_ptr *)&local_760->m_hasInf;
      _Stack_330._M_left = *(_Base_ptr *)&local_760->m_exactPrecision;
      local_310 = (double)CONCAT44(local_310._4_4_,(local_7d8->m_ctx).precision);
      local_300 = 0;
      local_308 = &local_718;
      (*local_798->_vptr_Statement[3])(local_798,(MessageBuilder *)local_338);
      pIVar22 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_718,
                           (pVVar12->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_338,pFVar4,pIVar22);
      puVar25 = local_1b8;
      lVar26 = 0;
      pMVar23 = (MessageBuilder *)local_338;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar27 + 0x10) =
               *(undefined8 *)
                (&(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar27);
          puVar1 = (undefined8 *)((long)&pMVar23->m_log + lVar27);
          uVar10 = puVar1[1];
          *(undefined8 *)(puVar25 + lVar27) = *puVar1;
          *(undefined8 *)((long)(puVar25 + lVar27) + 8) = uVar10;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar26 = lVar26 + 1;
        puVar25 = puVar25 + 0x18;
        pMVar23 = (MessageBuilder *)
                  &(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar26 != 4);
      bVar13 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_1b8,
                          (Matrix<float,_4,_4> *)
                          ((long)(local_7a8->m_data).m_data[0].m_data +
                          (long)((local_748.out1.
                                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_338 = (undefined1  [8])&_Stack_330._M_parent;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Shader output 1 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(this_00,bVar13,(string *)local_338);
      if (local_338 != (undefined1  [8])&_Stack_330._M_parent) {
        operator_delete((void *)local_338,(ulong)((long)&(_Stack_330._M_parent)->_M_color + 1));
      }
      pIVar22 = Environment::lookup<tcu::Matrix<float,4,4>>
                          ((Environment *)&local_718,
                           (local_7d0->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doConvert
                ((IVal *)local_338,pFVar4,pIVar22);
      puVar25 = local_6e8;
      lVar26 = 0;
      pMVar23 = (MessageBuilder *)local_338;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar27 + 0x10) =
               *(undefined8 *)
                (&(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
                lVar27);
          puVar1 = (undefined8 *)((long)&pMVar23->m_log + lVar27);
          uVar10 = puVar1[1];
          *(undefined8 *)(puVar25 + lVar27) = *puVar1;
          *(undefined8 *)((long)(puVar25 + lVar27) + 8) = uVar10;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x180);
        lVar26 = lVar26 + 1;
        puVar25 = puVar25 + 0x18;
        pMVar23 = (MessageBuilder *)
                  &(pMVar23->m_str).super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      } while (lVar26 != 4);
      bVar14 = contains<tcu::Matrix<float,4,4>>
                         ((IVal *)local_6e8,
                          (Matrix<float,_4,_4> *)
                          ((long)(local_7a8->m_data).m_data[0].m_data +
                          (long)((local_748.out0.
                                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                m_data));
      local_338 = (undefined1  [8])&_Stack_330._M_parent;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_338,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(this_00,bVar14,(string *)local_338);
      if (local_338 != (undefined1  [8])&_Stack_330._M_parent) {
        operator_delete((void *)local_338,(ulong)((long)&(_Stack_330._M_parent)->_M_color + 1));
      }
      pVVar12 = local_7d0;
      if (!bVar13 || !bVar14) {
        uVar16 = (int)local_770 + 1;
        local_770 = (ulong)uVar16;
        this_01 = (ostringstream *)(local_338 + 8);
        if ((int)uVar16 < 0x65) {
          local_338 = (undefined1  [8])((local_7d8->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream(this_01);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
          pVVar7 = (pVVar12->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          val = (Matrix<float,_4,_4> *)local_4d8;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_7c8,(BuiltinPrecisionTests *)pFVar4,
                     (FloatFormat *)
                     ((long)(local_7a8->m_data).m_data[0].m_data +
                     (long)(local_768->in0).
                           super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_4,_4> *)local_4e8._0_8_ != (Matrix<float,_4,_4> *)local_4d8) {
            operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
          pVVar7 = (pVVar12->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          pIVar22 = (IVal *)local_4d8;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = pIVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_7c8,(BuiltinPrecisionTests *)pFVar4,
                     (FloatFormat *)
                     ((long)(local_7a8->m_data).m_data[0].m_data +
                     (long)((local_748.out0.
                             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data),
                     (Matrix<float,_4,_4> *)pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_790,(BuiltinPrecisionTests *)pFVar4,(FloatFormat *)local_6e8,pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_790._M_dataplus._M_p,local_790._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._M_dataplus._M_p != &local_790.field_2) {
            operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4e8._0_8_ != (IVal *)local_4d8) {
            operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
          pVVar7 = (pVVar12->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_4>_>_>
                   .m_ptr;
          pIVar22 = (IVal *)local_4d8;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = pIVar22;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," = ",3);
          valueToString<tcu::Matrix<float,4,4>>
                    (&local_7c8,(BuiltinPrecisionTests *)pFVar4,
                     (FloatFormat *)
                     ((long)((local_748.out1.
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                     (long)(local_7a8->m_data).m_data[0].m_data),(Matrix<float,_4,_4> *)pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_7c8._M_dataplus._M_p,local_7c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,4,4>>
                    (&local_790,(BuiltinPrecisionTests *)pFVar4,(FloatFormat *)local_1b8,pIVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_01,local_790._M_dataplus._M_p,local_790._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._M_dataplus._M_p != &local_790.field_2) {
            operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4e8._0_8_ != (IVal *)local_4d8) {
            operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_01);
          std::ios_base::~ios_base(local_2c0);
        }
      }
      uVar28 = local_758 + 1;
    } while (uVar28 != local_750);
    iVar15 = (int)local_770;
    if (iVar15 < 0x65) {
      if (iVar15 == 0) goto LAB_01774362;
    }
    else {
      local_6e8 = (undefined1  [8])((local_7d8->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_6e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_6e0,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_6e0,iVar15 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_6e0," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_6e0);
      std::ios_base::~ios_base(local_670);
    }
    local_6e8 = (undefined1  [8])((local_7d8->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_6e0);
    std::ostream::operator<<((ostringstream *)&pVStack_6e0,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_6e0,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_6e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_6e0," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_6e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_6e0);
  std::ios_base::~ios_base(local_670);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_p != &local_4f8) {
    operator_delete(local_508._M_p,
                    CONCAT71(local_4f8._M_allocated_capacity._1_7_,local_4f8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_p != &local_518) {
    operator_delete(local_528._M_p,
                    CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_560 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_560 + 8));
  if (local_748.out1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_748.out0.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_748.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_748.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}